

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O2

string * iutest::detail::ToHexString<char>(string *__return_storage_ptr__,char value)

{
  char cVar1;
  size_t i;
  long lVar2;
  byte bVar3;
  uint uVar4;
  undefined7 in_register_00000031;
  char cVar5;
  char local_c [3];
  allocator<char> local_9;
  
  local_c[0] = '\0';
  local_c[1] = '\0';
  bVar3 = 4;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    uVar4 = (int)CONCAT71(in_register_00000031,value) >> (bVar3 & 0x1f) & 0xf;
    cVar1 = (char)uVar4;
    cVar5 = cVar1 + '0';
    if (9 < uVar4) {
      cVar5 = cVar1 + '7';
    }
    local_c[lVar2] = cVar5;
    bVar3 = bVar3 - 4;
  }
  local_c[2] = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_c,&local_9);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string ToHexString(T value)
{
    const size_t kN = sizeof(T)*2;
    char buf[kN + 1] = {0};
    for( size_t i=0; i < kN; ++i )
    {
        buf[i] = ToHex(static_cast<unsigned int>((value>>((kN-i-1)*4))));
    }
    buf[kN] = '\0';
    return buf;
}